

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

vector<Token,_std::allocator<Token>_> *
Lexer::tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,string *code,
               vector<Token,_std::allocator<Token>_> *verbatim)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<Token,_std::allocator<Token>_> *this;
  vector<Token,_std::allocator<Token>_> *tokens;
  Token tk;
  Lexer yylex;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Lexer local_88;
  
  local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(code->_M_dataplus)._M_p;
  paVar1 = &code->field_2;
  if (local_d0 == paVar1) {
    local_c0._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_c0._8_8_ = *(undefined8 *)((long)&code->field_2 + 8);
    local_d0 = &local_c0;
  }
  else {
    local_c0._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_88.yycode._M_string_length = code->_M_string_length;
  (code->_M_dataplus)._M_p = (pointer)paVar1;
  code->_M_string_length = 0;
  (code->field_2)._M_local_buf[0] = '\0';
  local_88.yycode._M_dataplus._M_p = (pointer)&local_88.yycode.field_2;
  if (local_d0 == &local_c0) {
    local_88.yycode.field_2._8_8_ = local_c0._8_8_;
  }
  else {
    local_88.yycode._M_dataplus._M_p = (pointer)local_d0;
  }
  local_88.yycode.field_2._M_allocated_capacity = local_c0._M_allocated_capacity;
  local_88.yytext._M_dataplus._M_p = (pointer)&local_88.yytext.field_2;
  local_c8 = 0;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffffffffff00;
  local_88.yytext._M_string_length = 0;
  local_88.yytext.field_2._M_local_buf[0] = '\0';
  local_88.yychar = '\n';
  local_88.yylineno = 1;
  local_88.yytokenlineno = 1;
  local_88.yypos._M_current = local_88.yycode._M_dataplus._M_p;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._0_4_ = T_EOF_SYMBOL;
  local_f8._4_4_ = 0;
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0 = &local_c0;
  do {
    operator()((Token *)local_b0,&local_88);
    local_f8 = local_b0;
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
    if (local_f8._0_4_ != T_TEXT || verbatim != (vector<Token,_std::allocator<Token>_> *)0x0) {
      this = verbatim;
      if (local_f8._0_4_ != T_TEXT) {
        this = __return_storage_ptr__;
      }
      std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(this,(Token *)local_f8);
    }
  } while (local_f8._0_4_ != T_EOF_SYMBOL);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,
                    CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.yytext._M_dataplus._M_p != &local_88.yytext.field_2) {
    operator_delete(local_88.yytext._M_dataplus._M_p,
                    CONCAT71(local_88.yytext.field_2._M_allocated_capacity._1_7_,
                             local_88.yytext.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.yycode._M_dataplus._M_p != &local_88.yycode.field_2) {
    operator_delete(local_88.yycode._M_dataplus._M_p,
                    local_88.yycode.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> Lexer::tokenize(std::string code,
                                   std::vector<Token>* verbatim) {
  Lexer yylex(std::move(code));
  std::vector<Token> tokens;
  Token tk;
  do {
    tk = yylex();
    if (tk.is(T_TEXT)) {
      if (verbatim) verbatim->push_back(std::move(tk));
      continue;
    }
    tokens.push_back(std::move(tk));
  } while (tk.isNot(T_EOF_SYMBOL));
  return tokens;
}